

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O3

bool __thiscall TGAImage::flip_horizontally(TGAImage *this)

{
  uint uVar1;
  int iVar2;
  TGAColor TVar3;
  int iVar4;
  int iVar5;
  uint x;
  uchar *puVar6;
  int y;
  TGAColor c2;
  TGAColor c1;
  uchar local_48 [4];
  uchar local_44;
  uchar local_40 [4];
  uchar local_3c;
  uchar *local_38;
  
  local_38 = this->data;
  if ((local_38 != (uchar *)0x0) && (uVar1 = this->width >> 1, 0 < (int)uVar1)) {
    iVar2 = this->height;
    x = 0;
    do {
      if (0 < iVar2) {
        y = 0;
        do {
          TVar3 = get(this,x,y);
          local_40 = TVar3.bgra;
          local_3c = TVar3.bytespp;
          TVar3 = get(this,this->width + ~x,y);
          local_48 = TVar3.bgra;
          local_44 = TVar3.bytespp;
          puVar6 = this->data;
          iVar2 = this->height;
          if (puVar6 != (uchar *)0x0) {
            iVar4 = this->width;
            if (y < iVar2 && (int)x < iVar4) {
              memcpy(puVar6 + (long)(int)(iVar4 * y + x) * (long)this->bytespp,local_48,
                     (long)this->bytespp);
              iVar4 = this->width;
              puVar6 = this->data;
              iVar2 = this->height;
            }
            iVar5 = iVar4 + ~x;
            if ((-1 < iVar5 && puVar6 != (uchar *)0x0) && (y < iVar2 && iVar5 < iVar4)) {
              memcpy(puVar6 + (long)(iVar4 * y + iVar5) * (long)this->bytespp,local_40,
                     (long)this->bytespp);
              iVar2 = this->height;
            }
          }
          y = y + 1;
        } while (y < iVar2);
      }
      x = x + 1;
    } while (x != uVar1);
  }
  return local_38 != (uchar *)0x0;
}

Assistant:

bool TGAImage::flip_horizontally() {
    if (!data) return false;
    int half = width>>1;
    for (int i=0; i<half; i++) {
        for (int j=0; j<height; j++) {
            TGAColor c1 = get(i, j);
            TGAColor c2 = get(width-1-i, j);
            set(i, j, c2);
            set(width-1-i, j, c1);
        }
    }
    return true;
}